

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void free_temp_pseudo(Proc *proc,Pseudo *pseudo,_Bool free_local)

{
  PseudoGenerator *pPStack_28;
  uint regbit;
  PseudoGenerator *gen;
  _Bool free_local_local;
  Pseudo *pseudo_local;
  Proc *proc_local;
  
  if ((*(uint *)pseudo >> 0x14 & 1) != 0) {
    return;
  }
  switch(*(uint *)pseudo & 0xf) {
  case 1:
    pPStack_28 = &proc->temp_flt_pseudos;
    break;
  case 2:
  case 3:
    pPStack_28 = &proc->temp_int_pseudos;
    break;
  case 4:
  case 0xb:
    pPStack_28 = &proc->temp_pseudos;
    if ((((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xb) &&
       ((pseudo->field_3).range_in_use != 0)) {
      __assert_fail("pseudo->range_in_use == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x269,"void free_temp_pseudo(Proc *, Pseudo *, _Bool)");
    }
    break;
  default:
    return;
  case 0xc:
    (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code =
         (1 << ((byte)(*(uint *)pseudo >> 4) & 0x1f) ^ RAVI_TANY) &
         (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code;
    return;
  case 0xe:
    free_temp_pseudo(proc,(pseudo->field_3).index_info.key,false);
    free_temp_pseudo(proc,(pseudo->field_3).index_info.container,false);
    return;
  }
  if (((free_local) ||
      (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xb)) ||
     ((pseudo->field_3).symbol == (LuaSymbol *)0x0)) {
    free_register(proc,pPStack_28,*(uint *)pseudo >> 4 & 0xffff);
  }
  return;
}

Assistant:

static void free_temp_pseudo(Proc *proc, Pseudo *pseudo, bool free_local)
{
	if (pseudo->freed)
		return;
	PseudoGenerator *gen;
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		if (pseudo->type == PSEUDO_RANGE) {
			// all PSEUDO_RANGE_SELECT should have been freed if the range is being freed
			assert(pseudo->range_in_use == 0);
		}
		break;
	case PSEUDO_INDEXED:
		free_temp_pseudo(proc, pseudo->index_info.key, false);
		free_temp_pseudo(proc, pseudo->index_info.container, false);
		return;
	case PSEUDO_RANGE_SELECT: {
		unsigned regbit = (1u << pseudo->regnum);
		// mark the register as no longer used; its only 1 bit not a proper ref count
		pseudo->range_pseudo->range_in_use &= ~regbit;
		return;
	}
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (!free_local && pseudo->type != PSEUDO_RANGE && pseudo->temp_for_local) {
		return;
	}
//	if (gen == &proc->temp_int_pseudos) {
//		fprintf(stderr, "Freeing reg %u\n", pseudo->regnum);
//	}
	free_register(proc, gen, pseudo->regnum);
}